

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManIsVerilogPrim(char *pName)

{
  int iVar1;
  int local_1c;
  int i;
  char *pName_local;
  
  local_1c = 0;
  while( true ) {
    if (s_VerilogPrims[local_1c].pName == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(pName,s_VerilogPrims[local_1c].pName);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return s_VerilogPrims[local_1c].Type;
}

Assistant:

static inline int Prs_ManIsVerilogPrim( char * pName )
{
    int i;
    for ( i = 0; s_VerilogPrims[i].pName; i++ )
        if ( !strcmp(pName, s_VerilogPrims[i].pName) )
            return s_VerilogPrims[i].Type;
    return 0;
}